

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

size_t __thiscall VGMPlayer::DeviceID2OptionID(VGMPlayer *this,UINT32 id)

{
  pointer pCVar1;
  size_t sVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((int)id < 0) {
    bVar3 = (byte)(id >> 0x10);
  }
  else {
    uVar4 = (ulong)id;
    pCVar1 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->_devices).
                   super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4) *
            -0x1111111111111111;
    if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
      return 0xffffffffffffffff;
    }
    id = (UINT32)pCVar1[uVar4].chipType;
    bVar3 = pCVar1[uVar4].chipID;
  }
  sVar2 = 0xffffffffffffffff;
  if (bVar3 < 2) {
    sVar2 = *(size_t *)((long)this->_devOptMap[0] + (ulong)bVar3 * 8 + (ulong)((id & 0xff) << 4));
  }
  return sVar2;
}

Assistant:

size_t VGMPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devices.size())
	{
		type = _devices[id].chipType;
		instance = _devices[id].chipID;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (instance < 2)
		return _devOptMap[type][instance];
	else
		return (size_t)-1;
}